

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallprimes.c
# Opt level: O0

void init_smallprimes(void)

{
  ulong uStack_10030;
  size_t i_2;
  size_t pos;
  size_t j;
  size_t i_1;
  size_t i;
  _Bool A [65536];
  
  if (smallprimes_array[0] == 0) {
    for (i_1 = 2; i_1 < 0x10000; i_1 = i_1 + 1) {
      A[i_1 - 8] = true;
    }
    for (j = 2; j < 0x10000; j = j + 1) {
      if ((A[j - 8] & 1U) != 0) {
        for (pos = j << 1; pos < 0x10000; pos = j + pos) {
          A[pos - 8] = false;
        }
      }
    }
    i_2 = 0;
    for (uStack_10030 = 2; uStack_10030 < 0x10000; uStack_10030 = uStack_10030 + 1) {
      if ((A[uStack_10030 - 8] & 1U) != 0) {
        if (0x198d < i_2) {
          __assert_fail("pos < NSMALLPRIMES",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/smallprimes.c"
                        ,0x26,"void init_smallprimes(void)");
        }
        smallprimes_array[i_2] = (unsigned_short)uStack_10030;
        i_2 = i_2 + 1;
      }
    }
    if (i_2 != 0x198e) {
      __assert_fail("pos == NSMALLPRIMES",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/smallprimes.c"
                    ,0x2b,"void init_smallprimes(void)");
    }
  }
  return;
}

Assistant:

void init_smallprimes(void)
{
    if (smallprimes_array[0])
        return;                        /* already done */

    bool A[65536];

    for (size_t i = 2; i < lenof(A); i++)
        A[i] = true;

    for (size_t i = 2; i < lenof(A); i++) {
        if (!A[i])
            continue;
        for (size_t j = 2*i; j < lenof(A); j += i)
            A[j] = false;
    }

    size_t pos = 0;
    for (size_t i = 2; i < lenof(A); i++) {
        if (A[i]) {
            assert(pos < NSMALLPRIMES);
            smallprimes_array[pos++] = i;
        }
    }

    assert(pos == NSMALLPRIMES);
}